

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O1

void ExpReplay::end_pass(expreplay *er)

{
  single_learner *psVar1;
  long lVar2;
  ulong uVar3;
  
  if (er->N != 0) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      if (er->filled[uVar3] == true) {
        psVar1 = er->base;
        (**(code **)(psVar1 + 0x28))
                  (*(undefined8 *)(psVar1 + 0x18),*(undefined8 *)(psVar1 + 0x20),
                   (long)(er->buf->super_example_predict).feature_space + lVar2 + -0x20);
        er->filled[uVar3] = false;
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x68d0;
    } while (uVar3 < er->N);
  }
  return;
}

Assistant:

void end_pass(expreplay& er)
{  // we need to go through and learn on everyone who remains
  // also need to clean up remaining examples
  for (size_t n = 0; n < er.N; n++)
    if (er.filled[n])
    {  // TODO: if er.replay_count > 1 do we need to play these more?
      er.base->learn(er.buf[n]);
      er.filled[n] = false;
    }
}